

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

Node * __thiscall Assimp::ColladaLoader::FindNode(ColladaLoader *this,Node *pNode,string *pName)

{
  size_t __n;
  size_t __n_00;
  pointer ppNVar1;
  int iVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  
  __n = (pNode->mName)._M_string_length;
  __n_00 = pName->_M_string_length;
  if (((__n != __n_00) ||
      ((__n != 0 &&
       (iVar2 = bcmp((pNode->mName)._M_dataplus._M_p,(pName->_M_dataplus)._M_p,__n), iVar2 != 0))))
     && (((pNode->mID)._M_string_length != __n_00 ||
         ((__n_00 != 0 &&
          (iVar2 = bcmp((pNode->mID)._M_dataplus._M_p,(pName->_M_dataplus)._M_p,__n_00), iVar2 != 0)
          ))))) {
    ppNVar1 = (pNode->mChildren).
              super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pNode->mChildren).
                  super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1;
    if (lVar5 == 0) {
      pNode = (Node *)0x0;
    }
    else {
      lVar5 = lVar5 >> 3;
      pNode = (Node *)0x0;
      lVar4 = 0;
      do {
        pNVar3 = FindNode(this,ppNVar1[lVar4],pName);
        if (pNVar3 != (Node *)0x0) {
          return pNVar3;
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
    }
  }
  return pNode;
}

Assistant:

const Collada::Node* ColladaLoader::FindNode(const Collada::Node* pNode, const std::string& pName) const
{
    if (pNode->mName == pName || pNode->mID == pName)
        return pNode;

    for (size_t a = 0; a < pNode->mChildren.size(); ++a)
    {
        const Collada::Node* node = FindNode(pNode->mChildren[a], pName);
        if (node)
            return node;
    }

    return NULL;
}